

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O3

void __thiscall CCharmapToUniMB::~CCharmapToUniMB(CCharmapToUniMB *this)

{
  void *__ptr;
  long lVar1;
  
  (this->super_CCharmapToUni).super_CCharmap._vptr_CCharmap =
       (_func_int **)&PTR__CCharmapToUniMB_0034d360;
  lVar1 = 0;
  do {
    __ptr = *(void **)((long)&this->map_[0].sub + lVar1);
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
    lVar1 = lVar1 + 0x10;
  } while ((int)lVar1 != 0x1000);
  return;
}

Assistant:

CCharmapToUniMB::~CCharmapToUniMB()
{
    int i;
    cmap_mb_entry *p;

    /* delete all of our sub-tables */
    for (i = 0, p = map_ ; i < 256 ; ++i, ++p)
    {
        /* if this sub-table was allocated, delete it */
        if (p->sub != 0)
            t3free(p->sub);
    }
}